

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O3

utf8proc_bool
utf8proc_grapheme_break_stateful(utf8proc_int32_t c1,utf8proc_int32_t c2,utf8proc_int32_t *state)

{
  utf8proc_bool uVar1;
  utf8proc_property_t *puVar2;
  utf8proc_property_t *puVar3;
  
  puVar2 = utf8proc_properties;
  puVar3 = utf8proc_properties;
  if ((uint)c1 < 0x110000) {
    puVar3 = utf8proc_properties +
             utf8proc_stage2table[(c1 & 0xffU) + (uint)utf8proc_stage1table[(uint)c1 >> 8]];
  }
  if ((uint)c2 < 0x110000) {
    puVar2 = utf8proc_properties +
             utf8proc_stage2table[(c2 & 0xffU) + (uint)utf8proc_stage1table[(uint)c2 >> 8]];
  }
  uVar1 = grapheme_break_extended
                    ((uint)(*(ushort *)&puVar3->field_0x14 >> 8),(uint)(byte)puVar2->field_0x15,
                     state);
  return uVar1;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_bool utf8proc_grapheme_break_stateful(
    utf8proc_int32_t c1, utf8proc_int32_t c2, utf8proc_int32_t *state) {

  return grapheme_break_extended(utf8proc_get_property(c1)->boundclass,
                                 utf8proc_get_property(c2)->boundclass,
                                 state);
}